

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode VELOCYPACK_XXH32_update(XXH32_state_t *state,void *input,size_t len)

{
  xxh_u32 xVar1;
  xxh_u32 xVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong in_RDX;
  ulong in_RSI;
  uint *in_RDI;
  xxh_u32 v4;
  xxh_u32 v3;
  xxh_u32 v2;
  xxh_u32 v1;
  xxh_u8 *limit;
  xxh_u32 *p32;
  xxh_u8 *bEnd;
  xxh_u8 *p;
  xxh_u32 in_stack_ffffffffffffff90;
  xxh_u32 in_stack_ffffffffffffff94;
  xxh_u32 in_stack_ffffffffffffff98;
  xxh_u32 in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_28;
  XXH_errorcode local_4;
  
  if (in_RSI == 0) {
    local_4 = XXH_ERROR;
  }
  else {
    uVar7 = in_RSI + in_RDX;
    *in_RDI = (int)in_RDX + *in_RDI;
    in_RDI[1] = (uint)(0xf < in_RDX || 0xf < *in_RDI) | in_RDI[1];
    if (in_RDI[10] + in_RDX < 0x10) {
      XXH_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_RDI[10] = (int)in_RDX + in_RDI[10];
      local_4 = XXH_OK;
    }
    else {
      local_44 = in_stack_ffffffffffffff90;
      local_48 = in_stack_ffffffffffffff94;
      local_4c = in_stack_ffffffffffffff98;
      local_50 = in_stack_ffffffffffffff9c;
      local_28 = in_RSI;
      if (in_RDI[10] != 0) {
        XXH_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        in_stack_ffffffffffffffa0 = in_RDI[2];
        xVar1 = XXH_readLE32((void *)0x124be3);
        xVar1 = XXH32_round(in_stack_ffffffffffffffa0,xVar1);
        in_RDI[2] = xVar1;
        in_stack_ffffffffffffffa4 = in_RDI[3];
        xVar1 = XXH_readLE32((void *)0x124c1c);
        xVar1 = XXH32_round(in_stack_ffffffffffffffa4,xVar1);
        in_RDI[3] = xVar1;
        xVar1 = in_RDI[4];
        xVar2 = XXH_readLE32((void *)0x124c55);
        xVar1 = XXH32_round(xVar1,xVar2);
        in_RDI[4] = xVar1;
        xVar1 = in_RDI[5];
        xVar2 = XXH_readLE32((void *)0x124c8e);
        xVar1 = XXH32_round(xVar1,xVar2);
        in_RDI[5] = xVar1;
        local_28 = in_RSI + (0x10 - in_RDI[10]);
        in_RDI[10] = 0;
        local_44 = in_stack_ffffffffffffff90;
        local_48 = in_stack_ffffffffffffff94;
        local_4c = in_stack_ffffffffffffff98;
        local_50 = in_stack_ffffffffffffff9c;
      }
      if (local_28 <= uVar7 - 0x10) {
        uVar6 = in_RDI[5];
        uVar5 = in_RDI[4];
        uVar4 = in_RDI[3];
        uVar3 = in_RDI[2];
        do {
          local_44 = uVar3;
          local_48 = uVar4;
          local_4c = uVar5;
          local_50 = uVar6;
          xVar1 = XXH_readLE32((void *)0x124d32);
          uVar3 = XXH32_round(local_44,xVar1);
          xVar1 = XXH_readLE32((void *)0x124d61);
          uVar4 = XXH32_round(local_48,xVar1);
          xVar1 = XXH_readLE32((void *)0x124d90);
          uVar5 = XXH32_round(local_4c,xVar1);
          xVar1 = XXH_readLE32((void *)0x124dbf);
          uVar6 = XXH32_round(local_50,xVar1);
          local_28 = local_28 + 0x10;
        } while (local_28 <= uVar7 - 0x10);
        in_RDI[2] = uVar3;
        in_RDI[3] = uVar4;
        in_RDI[4] = uVar5;
        in_RDI[5] = uVar6;
      }
      if (local_28 < uVar7) {
        XXH_memcpy((void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (void *)CONCAT44(local_50,local_4c),CONCAT44(local_48,local_44));
        in_RDI[10] = (int)uVar7 - (int)local_28;
      }
      local_4 = XXH_OK;
    }
  }
  return local_4;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_update(XXH32_state_t* state,
                                          const void* input, size_t len) {
  if (input == NULL)
#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && \
    (XXH_ACCEPT_NULL_INPUT_POINTER >= 1)
    return XXH_OK;
#else
    return XXH_ERROR;
#endif

  {
    const xxh_u8* p = (const xxh_u8*)input;
    const xxh_u8* const bEnd = p + len;

    state->total_len_32 += (XXH32_hash_t)len;
    state->large_len |=
        (XXH32_hash_t)((len >= 16) | (state->total_len_32 >= 16));

    if (state->memsize + len < 16) { /* fill in tmp buffer */
      XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, len);
      state->memsize += (XXH32_hash_t)len;
      return XXH_OK;
    }

    if (state->memsize) { /* some data left from previous update */
      XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input,
                 16 - state->memsize);
      {
        const xxh_u32* p32 = state->mem32;
        state->v1 = XXH32_round(state->v1, XXH_readLE32(p32));
        p32++;
        state->v2 = XXH32_round(state->v2, XXH_readLE32(p32));
        p32++;
        state->v3 = XXH32_round(state->v3, XXH_readLE32(p32));
        p32++;
        state->v4 = XXH32_round(state->v4, XXH_readLE32(p32));
      }
      p += 16 - state->memsize;
      state->memsize = 0;
    }

    if (p <= bEnd - 16) {
      const xxh_u8* const limit = bEnd - 16;
      xxh_u32 v1 = state->v1;
      xxh_u32 v2 = state->v2;
      xxh_u32 v3 = state->v3;
      xxh_u32 v4 = state->v4;

      do {
        v1 = XXH32_round(v1, XXH_readLE32(p));
        p += 4;
        v2 = XXH32_round(v2, XXH_readLE32(p));
        p += 4;
        v3 = XXH32_round(v3, XXH_readLE32(p));
        p += 4;
        v4 = XXH32_round(v4, XXH_readLE32(p));
        p += 4;
      } while (p <= limit);

      state->v1 = v1;
      state->v2 = v2;
      state->v3 = v3;
      state->v4 = v4;
    }

    if (p < bEnd) {
      XXH_memcpy(state->mem32, p, (size_t)(bEnd - p));
      state->memsize = (unsigned)(bEnd - p);
    }
  }

  return XXH_OK;
}